

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBuilderBeamTaperedTimoshenko::BuildBeam
          (ChBuilderBeamTaperedTimoshenko *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *sect,int N,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeA,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeB,ChVector<double> Ydir)

{
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_00;
  double dVar1;
  element_type *peVar2;
  element_type *peVar3;
  ChMesh *pCVar4;
  element_type *peVar5;
  shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *this_01;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ChElementBase local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko> element;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeBi;
  ChQuaternion<double> local_218;
  __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  *local_1f8;
  ChBuilderBeamTaperedTimoshenko *local_1f0;
  double local_1e8;
  double local_1e0;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *local_1d8;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> *local_1d0;
  double local_1c8;
  double local_1c0;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_198 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_188 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  ChVector<double> v_1;
  __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  local_158;
  ChVector<double> v;
  double local_130;
  ChMatrix33<double> mrot;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  local_1f8 = &sect->
               super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_1f0 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(this_00);
  peVar2 = (nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = (nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])&(peVar2->super_ChNodeFEAbase).field_0x20,
                  *(undefined1 (*) [16])&(peVar3->super_ChNodeFEAbase).field_0x20);
  v.m_data[2] = *(double *)&peVar2->field_0x30 - *(double *)&peVar3->field_0x30;
  local_1d0 = &nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>;
  ChMatrix33<double>::Set_A_Xdir(&mrot,&v,(ChVector<double> *)Ydir.m_data[0]);
  local_1d8 = nodeA;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(this_00,nodeA);
  local_1e8 = (double)(long)N;
  local_1e0 = (double)N;
  local_1c8 = (double)((ulong)(uint)(~(N >> 0x1f) & N) << 4);
  dVar6 = 4.94065645841247e-324;
  for (dVar7 = 0.0; local_1c8 != dVar7; dVar7 = (double)((long)dVar7 + 0x10)) {
    dVar8 = (double)SUB84(dVar6,0) / local_1e0;
    peVar2 = (local_1d8->
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    dVar1 = *(double *)&peVar2->field_0x30;
    auVar9 = *(undefined1 (*) [16])&(peVar2->super_ChNodeFEAbase).field_0x20;
    auVar10 = vsubpd_avx(*(undefined1 (*) [16])&(local_1d0->_M_ptr->super_ChNodeFEAbase).field_0x20,
                         auVar9);
    v_1.m_data[0] = auVar9._0_8_ + dVar8 * auVar10._0_8_;
    v_1.m_data[1] = auVar9._8_8_ + dVar8 * auVar10._8_8_;
    v_1.m_data[2] = dVar1 + dVar8 * (*(double *)&local_1d0->_M_ptr->field_0x30 - dVar1);
    nodeBi.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    nodeBi.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((long)dVar6 < (long)local_1e8) {
      ChFrame<double>::ChFrame((ChFrame<double> *)&v,&v_1,&mrot);
      chrono_types::make_shared<chrono::fea::ChNodeFEAxyzrot,_chrono::ChFrame<double>,_0>
                ((chrono_types *)&local_218,(ChFrame<double> *)&v);
      std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&nodeBi.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_218);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218.m_data + 1));
      pCVar4 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::fea::ChNodeFEAxyzrot,void>
                (local_188,
                 &nodeBi.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
      ChMesh::AddNode(pCVar4,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_188);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180);
    }
    else {
      std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&nodeBi.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>,
                 local_1d0);
    }
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::push_back(this_00,&nodeBi);
    local_1c0 = dVar6;
    chrono_types::make_shared<chrono::fea::ChElementBeamTaperedTimoshenko,_0>();
    pCVar4 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,void>
              (local_198,
               &element.
                super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
              );
    ChMesh::AddElement(pCVar4,(shared_ptr<chrono::fea::ChElementBase> *)local_198);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190);
    std::
    vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
    ::push_back(&local_1f0->beam_elems,
                (value_type *)
                &element.
                 super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
               );
    peVar5 = element.
             super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1a8,
               (__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this_00->
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr + (long)dVar7));
    std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1b8,
               (__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(this_00->
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + (long)dVar7));
    (*(peVar5->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
      [0x1a])(peVar5,&local_1a8,&local_1b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
    ChMatrix33<double>::Get_A_quaternion((ChQuaternion<double> *)&v,&mrot);
    peVar5 = element.
             super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    auVar9._0_8_ = -local_130;
    auVar9._8_8_ = 0x8000000000000000;
    local_218.m_data[1] = (double)((ulong)v.m_data[1] ^ 0x8000000000000000);
    local_218.m_data[2] = (double)((ulong)v.m_data[2] ^ 0x8000000000000000);
    local_218.m_data[0] = v.m_data[0];
    local_218.m_data[3] = (double)vmovlpd_avx(auVar9);
    ChElementBeamTaperedTimoshenko::GetNodeA((ChElementBeamTaperedTimoshenko *)&local_258);
    ChQuaternion<double>::operator%
              (&local_50,&local_218,(ChQuaternion<double> *)(local_258._vptr_ChElementBase + 7));
    ChQuaternion<double>::operator=(&peVar5->q_refrotA,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250);
    peVar5 = element.
             super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    auVar10._0_8_ = -local_130;
    auVar10._8_8_ = 0x8000000000000000;
    local_218.m_data[1] = (double)((ulong)v.m_data[1] ^ 0x8000000000000000);
    local_218.m_data[2] = (double)((ulong)v.m_data[2] ^ 0x8000000000000000);
    local_218.m_data[0] = v.m_data[0];
    local_218.m_data[3] = (double)vmovlpd_avx(auVar10);
    ChElementBeamTaperedTimoshenko::GetNodeB((ChElementBeamTaperedTimoshenko *)&local_258);
    ChQuaternion<double>::operator%
              (&local_70,&local_218,(ChQuaternion<double> *)(local_258._vptr_ChElementBase + 7));
    ChQuaternion<double>::operator=(&peVar5->q_refrotB,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250);
    this_01 = &(element.
                super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->tapered_section;
    std::
    __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_158,local_1f8);
    std::
    __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&this_01->
                 super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                ,&local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&element.
                super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&nodeBi.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    dVar6 = (double)((long)local_1c0 + 1);
  }
  return;
}

Assistant:

void ChBuilderBeamTaperedTimoshenko::BuildBeam(
    std::shared_ptr<ChMesh> mesh,              // mesh to store the resulting elements
    std::shared_ptr<ChBeamSectionTaperedTimoshenkoAdvancedGeneric> sect,  // section material for beam elements
                                   const int N,                               // number of elements in the segment
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeA,    // starting point
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeB,    // ending point
                                   const ChVector<> Ydir                      // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(nodeB->Frame().GetPos() - nodeA->Frame().GetPos(), Ydir);

    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = nodeA->Frame().GetPos() + (nodeB->Frame().GetPos() - nodeA->Frame().GetPos()) * eta;

        std::shared_ptr<ChNodeFEAxyzrot> nodeBi;
        if (i < N) {
            nodeBi = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
            mesh->AddNode(nodeBi);
        } else
            nodeBi = nodeB;  // last node: use the one passed as parameter.

        beam_nodes.push_back(nodeBi);

        auto element = chrono_types::make_shared<ChElementBeamTaperedTimoshenko>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        ChQuaternion<> elrot = mrot.Get_A_quaternion();
        element->SetNodeAreferenceRot(elrot.GetConjugate() % element->GetNodeA()->Frame().GetRot());
        element->SetNodeBreferenceRot(elrot.GetConjugate() % element->GetNodeB()->Frame().GetRot());

        element->SetTaperedSection(sect);
    }
}